

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowNthValueExecutor::EvaluateInternal
          (WindowNthValueExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  WindowExecutorLocalState *this_00;
  WindowExcludeMode WVar1;
  ulong uVar2;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> _Var3;
  WindowCollection *r;
  bool bVar4;
  type this_01;
  const_reference pvVar5;
  reference pvVar6;
  ulong uVar7;
  _func_int *p_Var8;
  _func_int *p_Var9;
  pointer this_02;
  idx_t row_idx_00;
  ulong uVar10;
  size_type __n;
  idx_t i;
  iterator __begin3;
  WindowExecutorLocalState *this_03;
  ulong uVar11;
  WindowCursor *pWVar12;
  pair<unsigned_long,_unsigned_long> pVar13;
  _func_int *local_88;
  data_ptr_t local_80;
  idx_t local_78;
  WindowExecutorLocalState *local_70;
  data_ptr_t local_68;
  data_ptr_t local_60;
  data_ptr_t local_58;
  ValidityMask *local_50;
  WindowInputExpression nth_col;
  
  this_01 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
            operator*(&lstate[0x15].range_cursor);
  this_00 = lstate + 2;
  this_03 = lstate + 0x14;
  local_70 = lstate;
  local_50 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                       ((optional_ptr<duckdb::ValidityMask,_true> *)&gstate[2].executor);
  WVar1 = gstate->executor->wexpr->exclude_clause;
  WindowInputExpression::WindowInputExpression
            (&nth_col,eval_chunk,(this->super_WindowValueExecutor).nth_idx);
  pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,6);
  local_58 = pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,7);
  local_60 = pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,2);
  local_80 = pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,3);
  local_68 = pvVar5->data;
  i = 0;
  local_78 = count;
  do {
    if (i == count) {
      return;
    }
    uVar11 = *(ulong *)(local_58 + i * 8);
    uVar2 = *(ulong *)(local_60 + i * 8);
    if (WVar1 == NO_OTHER) {
      __n = 0;
    }
    else {
      uVar7 = row_idx;
      if (WVar1 != CURRENT_ROW) {
        uVar7 = *(ulong *)(local_80 + i * 8);
      }
      if (uVar2 <= uVar7) {
        uVar7 = uVar2;
      }
      if (uVar7 <= uVar11) {
        uVar7 = uVar11;
      }
      pvVar6 = vector<duckdb::FrameBounds,_true>::get<true>
                         ((vector<duckdb::FrameBounds,_true> *)this_03,0);
      pvVar6->start = uVar11;
      pvVar6->end = uVar7;
      if (WVar1 == TIES) {
        uVar7 = uVar11;
        if (uVar11 < row_idx) {
          uVar7 = row_idx;
        }
        if (uVar2 <= uVar7) {
          uVar7 = uVar2;
        }
        uVar10 = row_idx + 1;
        if (uVar2 <= row_idx + 1) {
          uVar10 = uVar2;
        }
        if (uVar10 <= uVar11) {
          uVar10 = uVar11;
        }
        pvVar6 = vector<duckdb::FrameBounds,_true>::get<true>
                           ((vector<duckdb::FrameBounds,_true> *)this_03,1);
        pvVar6->start = uVar7;
        pvVar6->end = uVar10;
        __n = 2;
        count = local_78;
LAB_00a89969:
        uVar7 = *(ulong *)(local_68 + i * 8);
      }
      else {
        __n = 1;
        if (WVar1 != CURRENT_ROW) goto LAB_00a89969;
        uVar7 = row_idx + 1;
      }
      if (uVar11 < uVar7) {
        uVar11 = uVar7;
      }
      if (uVar2 <= uVar11) {
        uVar11 = uVar2;
      }
    }
    pvVar6 = vector<duckdb::FrameBounds,_true>::get<true>
                       ((vector<duckdb::FrameBounds,_true> *)this_03,__n);
    pvVar6->start = uVar11;
    pvVar6->end = uVar2;
    bVar4 = WindowInputExpression::CellIsNull(&nth_col,i);
    if ((bVar4) ||
       (p_Var8 = (_func_int *)WindowInputExpression::GetCell<long>(&nth_col,i), (long)p_Var8 < 1)) {
      FlatVector::SetNull(result,i,true);
    }
    else {
      pWVar12 = (WindowCursor *)local_70[0x14].super_WindowExecutorState._vptr_WindowExecutorState;
      _Var3._M_head_impl =
           local_70[0x14].range_cursor.
           super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
           super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
           .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
      local_88 = p_Var8;
      if (gstate[2].partition_mask == (ValidityMask *)0x0) {
        for (; pWVar12 != _Var3._M_head_impl;
            pWVar12 = (WindowCursor *)((long)&(pWVar12->state).current_chunk_state.handles._M_h + 8)
            ) {
          r = (WindowCollection *)(pWVar12->state).current_chunk_state.handles._M_h._M_buckets;
          if ((pWVar12->paged < r) &&
             (row_idx_00 = WindowBoundariesState::FindNextStart
                                     (local_50,(idx_t)pWVar12->paged,(idx_t)r,(idx_t *)&local_88),
             local_88 == (_func_int *)0x0)) {
            WindowCursor::CopyCell(this_01,0,row_idx_00,result,i);
            goto LAB_00a89aad;
          }
        }
      }
      else {
        p_Var9 = (_func_int *)0x0;
        for (; pWVar12 != _Var3._M_head_impl;
            pWVar12 = (WindowCursor *)((long)&(pWVar12->state).current_chunk_state + 8)) {
          p_Var9 = p_Var9 + (*(long *)&(pWVar12->state).current_chunk_state.handles -
                            (long)pWVar12->paged);
        }
        if (p_Var8 < p_Var9) {
          this_02 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                    ::operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                                  *)&gstate[2].partition_mask);
          pVar13 = WindowIndexTree::SelectNth(this_02,(SubFrames *)this_03,(idx_t)(p_Var8 + -1));
          if (pVar13.second == 0) {
            WindowCursor::CopyCell(this_01,0,pVar13.first,result,i);
          }
          else {
            FlatVector::SetNull(result,i,true);
          }
          goto LAB_00a89aad;
        }
      }
      FlatVector::SetNull(result,i,true);
    }
LAB_00a89aad:
    i = i + 1;
    row_idx = row_idx + 1;
  } while( true );
}

Assistant:

void WindowNthValueExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                              DataChunk &eval_chunk, Vector &result, idx_t count, idx_t row_idx) const {
	auto &gvstate = gstate.Cast<WindowValueGlobalState>();
	auto &lvstate = lstate.Cast<WindowValueLocalState>();
	auto &cursor = *lvstate.cursor;
	auto &bounds = lvstate.bounds;
	auto &frames = lvstate.frames;
	auto &ignore_nulls = *gvstate.ignore_nulls;
	auto exclude_mode = gvstate.executor.wexpr.exclude_clause;
	D_ASSERT(cursor.chunk.ColumnCount() == 1);
	WindowInputExpression nth_col(eval_chunk, nth_idx);
	WindowAggregator::EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t i) {
		// Returns value evaluated at the row that is the n'th row of the window frame (counting from 1);
		// returns NULL if there is no such row.
		if (nth_col.CellIsNull(i)) {
			FlatVector::SetNull(result, i, true);
			return;
		}
		auto n_param = nth_col.GetCell<int64_t>(i);
		if (n_param < 1) {
			FlatVector::SetNull(result, i, true);
			return;
		}

		//	Decrement as we go along.
		auto n = idx_t(n_param);

		if (gvstate.value_tree) {
			idx_t frame_width = 0;
			for (const auto &frame : frames) {
				frame_width += frame.end - frame.start;
			}

			if (n < frame_width) {
				const auto nth_index = gvstate.value_tree->SelectNth(frames, n - 1);
				if (nth_index.second) {
					// Past end of frame
					FlatVector::SetNull(result, i, true);
				} else {
					cursor.CopyCell(0, nth_index.first, result, i);
				}
			} else {
				FlatVector::SetNull(result, i, true);
			}
			return;
		}

		for (const auto &frame : frames) {
			if (frame.start >= frame.end) {
				continue;
			}

			const auto nth_index = WindowBoundariesState::FindNextStart(ignore_nulls, frame.start, frame.end, n);
			if (!n) {
				cursor.CopyCell(0, nth_index, result, i);
				return;
			}
		}
		FlatVector::SetNull(result, i, true);
	});
}